

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  StackItemT<embree::NodeRefPtr<4>_> SVar8;
  StackItemT<embree::NodeRefPtr<4>_> SVar9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  long lVar11;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar12;
  undefined4 uVar13;
  float *vertices;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar14;
  UVIdentity<4> *pUVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar105 [16];
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  undefined1 auVar115 [16];
  float fVar116;
  float fVar119;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar129 [16];
  float fVar135;
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined1 local_1208 [16];
  undefined1 (*local_11f8) [16];
  long local_11f0;
  long local_11e8;
  ulong local_11e0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1198;
  undefined8 uStack_1190;
  vfloat<4> tNear;
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1038;
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 uStack_fc0;
  undefined4 uStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint uStack_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar14 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1058._4_4_ = uVar13;
  local_1058._0_4_ = uVar13;
  local_1058._8_4_ = uVar13;
  local_1058._12_4_ = uVar13;
  auVar95 = ZEXT1664(local_1058);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1068._4_4_ = uVar13;
  local_1068._0_4_ = uVar13;
  local_1068._8_4_ = uVar13;
  local_1068._12_4_ = uVar13;
  auVar96 = ZEXT1664(local_1068);
  uVar13 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1078._4_4_ = uVar13;
  local_1078._0_4_ = uVar13;
  local_1078._8_4_ = uVar13;
  local_1078._12_4_ = uVar13;
  auVar103 = ZEXT1664(local_1078);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar126 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar135 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar108 = fVar120 * 0.99999964;
  fVar113 = fVar126 * 0.99999964;
  fVar116 = fVar135 * 0.99999964;
  fVar120 = fVar120 * 1.0000004;
  fVar126 = fVar126 * 1.0000004;
  fVar135 = fVar135 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_11e0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = local_11e0 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar80._4_4_ = iVar2;
  auVar80._0_4_ = iVar2;
  auVar80._8_4_ = iVar2;
  auVar80._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_11f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_1088 = fVar108;
  fStack_1084 = fVar108;
  fStack_1080 = fVar108;
  fStack_107c = fVar108;
  local_1098 = fVar113;
  fStack_1094 = fVar113;
  fStack_1090 = fVar113;
  fStack_108c = fVar113;
  local_10a8 = fVar116;
  fStack_10a4 = fVar116;
  fStack_10a0 = fVar116;
  fStack_109c = fVar116;
  local_10b8 = fVar120;
  fStack_10b4 = fVar120;
  fStack_10b0 = fVar120;
  fStack_10ac = fVar120;
  local_10c8 = fVar126;
  fStack_10c4 = fVar126;
  fStack_10c0 = fVar126;
  fStack_10bc = fVar126;
  local_10d8 = fVar135;
  fStack_10d4 = fVar135;
  fStack_10d0 = fVar135;
  fStack_10cc = fVar135;
  fVar133 = fVar135;
  fVar131 = fVar135;
  fVar128 = fVar135;
  fVar125 = fVar126;
  fVar124 = fVar126;
  fVar121 = fVar126;
  fVar119 = fVar120;
  fVar134 = fVar120;
  fVar132 = fVar120;
  fVar130 = fVar116;
  fVar127 = fVar116;
  fVar114 = fVar116;
  fVar112 = fVar113;
  fVar111 = fVar113;
  fVar109 = fVar113;
  fVar107 = fVar108;
  fVar106 = fVar108;
  fVar104 = fVar108;
LAB_00505955:
  do {
    pSVar12 = pSVar14 + -1;
    pSVar14 = pSVar14 + -1;
    if ((float)pSVar12->dist <= *(float *)(ray + k * 4 + 0x80)) {
      uVar21 = (pSVar14->ptr).ptr;
      while ((uVar21 & 8) == 0) {
        uVar16 = uVar21 & 0xfffffffffffffff0;
        uVar13 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar44._4_4_ = uVar13;
        auVar44._0_4_ = uVar13;
        auVar44._8_4_ = uVar13;
        auVar44._12_4_ = uVar13;
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar27),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + uVar27));
        auVar45 = vsubps_avx(auVar45,auVar95._0_16_);
        auVar53._0_4_ = fVar104 * auVar45._0_4_;
        auVar53._4_4_ = fVar106 * auVar45._4_4_;
        auVar53._8_4_ = fVar107 * auVar45._8_4_;
        auVar53._12_4_ = fVar108 * auVar45._12_4_;
        auVar45 = vmaxps_avx(auVar80,auVar53);
        auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + local_11e0),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + local_11e0));
        auVar53 = vsubps_avx(auVar53,auVar96._0_16_);
        auVar58._0_4_ = fVar109 * auVar53._0_4_;
        auVar58._4_4_ = fVar111 * auVar53._4_4_;
        auVar58._8_4_ = fVar112 * auVar53._8_4_;
        auVar58._12_4_ = fVar113 * auVar53._12_4_;
        auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar33),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + uVar33));
        auVar53 = vsubps_avx(auVar53,auVar103._0_16_);
        auVar65._0_4_ = fVar114 * auVar53._0_4_;
        auVar65._4_4_ = fVar127 * auVar53._4_4_;
        auVar65._8_4_ = fVar130 * auVar53._8_4_;
        auVar65._12_4_ = fVar116 * auVar53._12_4_;
        auVar53 = vmaxps_avx(auVar58,auVar65);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar45,auVar53);
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar27 ^ 0x10)),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar27 ^ 0x10)));
        auVar45 = vsubps_avx(auVar45,auVar95._0_16_);
        auVar59._0_4_ = fVar132 * auVar45._0_4_;
        auVar59._4_4_ = fVar134 * auVar45._4_4_;
        auVar59._8_4_ = fVar119 * auVar45._8_4_;
        auVar59._12_4_ = fVar120 * auVar45._12_4_;
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar22),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + uVar22));
        auVar45 = vsubps_avx(auVar45,auVar96._0_16_);
        auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar33 ^ 0x10)),auVar44,
                                  *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar33 ^ 0x10)));
        auVar66._0_4_ = fVar121 * auVar45._0_4_;
        auVar66._4_4_ = fVar124 * auVar45._4_4_;
        auVar66._8_4_ = fVar125 * auVar45._8_4_;
        auVar66._12_4_ = fVar126 * auVar45._12_4_;
        auVar45 = vsubps_avx(auVar53,auVar103._0_16_);
        auVar74._0_4_ = fVar128 * auVar45._0_4_;
        auVar74._4_4_ = fVar131 * auVar45._4_4_;
        auVar74._8_4_ = fVar133 * auVar45._8_4_;
        auVar74._12_4_ = fVar135 * auVar45._12_4_;
        auVar45 = vminps_avx(auVar66,auVar74);
        auVar53 = vminps_avx(auVar43._0_16_,auVar59);
        auVar45 = vminps_avx(auVar53,auVar45);
        if (((uint)uVar21 & 7) == 6) {
          auVar53 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar45,2);
          auVar45 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar44,2);
          auVar44 = vcmpps_avx(auVar44,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
          auVar45 = vandps_avx(auVar45,auVar44);
          auVar45 = vandps_avx(auVar45,auVar53);
        }
        else {
          auVar45 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar45,2);
        }
        auVar45 = vpslld_avx(auVar45,0x1f);
        uVar19 = vmovmskps_avx(auVar45);
        if (uVar19 == 0) {
          if (pSVar14 == stack) {
            return;
          }
          goto LAB_00505955;
        }
        uVar19 = uVar19 & 0xff;
        lVar11 = 0;
        for (uVar21 = (ulong)uVar19; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar21 = *(ulong *)(uVar16 + lVar11 * 8);
        uVar19 = uVar19 - 1 & uVar19;
        uVar18 = (ulong)uVar19;
        if (uVar19 != 0) {
          uVar4 = tNear.field_0.i[lVar11];
          lVar11 = 0;
          for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar19 = uVar19 - 1 & uVar19;
          uVar20 = (ulong)uVar19;
          uVar18 = *(ulong *)(uVar16 + lVar11 * 8);
          uVar5 = tNear.field_0.i[lVar11];
          if (uVar19 == 0) {
            if (uVar4 < uVar5) {
              (pSVar14->ptr).ptr = uVar18;
              pSVar14->dist = uVar5;
              pSVar14 = pSVar14 + 1;
            }
            else {
              (pSVar14->ptr).ptr = uVar21;
              pSVar14->dist = uVar4;
              pSVar14 = pSVar14 + 1;
              uVar21 = uVar18;
            }
          }
          else {
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar21;
            auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar4));
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar18;
            auVar53 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar5));
            lVar11 = 0;
            for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar19 = uVar19 - 1 & uVar19;
            uVar21 = (ulong)uVar19;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = *(ulong *)(uVar16 + lVar11 * 8);
            auVar58 = vpunpcklqdq_avx(auVar60,ZEXT416((uint)tNear.field_0.i[lVar11]));
            auVar44 = vpcmpgtd_avx(auVar53,auVar45);
            if (uVar19 == 0) {
              auVar59 = vpshufd_avx(auVar44,0xaa);
              auVar44 = vblendvps_avx(auVar53,auVar45,auVar59);
              auVar45 = vblendvps_avx(auVar45,auVar53,auVar59);
              auVar53 = vpcmpgtd_avx(auVar58,auVar44);
              auVar59 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar58,auVar44,auVar59);
              auVar44 = vblendvps_avx(auVar44,auVar58,auVar59);
              auVar58 = vpcmpgtd_avx(auVar44,auVar45);
              auVar58 = vpshufd_avx(auVar58,0xaa);
              SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar44,auVar45,auVar58);
              SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar44,auVar58);
              *pSVar14 = SVar9;
              pSVar14[1] = SVar8;
              uVar21 = auVar53._0_8_;
              pSVar14 = pSVar14 + 2;
            }
            else {
              lVar11 = 0;
              for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(uVar16 + lVar11 * 8);
              auVar65 = vpunpcklqdq_avx(auVar75,ZEXT416((uint)tNear.field_0.i[lVar11]));
              auVar59 = vpshufd_avx(auVar44,0xaa);
              auVar44 = vblendvps_avx(auVar53,auVar45,auVar59);
              auVar45 = vblendvps_avx(auVar45,auVar53,auVar59);
              auVar53 = vpcmpgtd_avx(auVar65,auVar58);
              auVar59 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar65,auVar58,auVar59);
              auVar58 = vblendvps_avx(auVar58,auVar65,auVar59);
              auVar59 = vpcmpgtd_avx(auVar58,auVar45);
              auVar65 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar58,auVar45,auVar65);
              SVar8 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar45,auVar58,auVar65);
              auVar45 = vpcmpgtd_avx(auVar53,auVar44);
              auVar58 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar53,auVar44,auVar58);
              auVar53 = vblendvps_avx(auVar44,auVar53,auVar58);
              auVar44 = vpcmpgtd_avx(auVar59,auVar53);
              auVar44 = vpshufd_avx(auVar44,0xaa);
              SVar9 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar59,auVar53,auVar44);
              SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar53,auVar59,auVar44);
              *pSVar14 = SVar8;
              pSVar14[1] = SVar10;
              pSVar14[2] = SVar9;
              uVar21 = auVar45._0_8_;
              pSVar14 = pSVar14 + 3;
            }
          }
        }
      }
      local_11f0 = (ulong)((uint)uVar21 & 0xf) - 8;
      if (local_11f0 != 0) {
        uVar21 = uVar21 & 0xfffffffffffffff0;
        local_11e8 = 0;
        do {
          lVar31 = local_11e8 * 0x50;
          pSVar6 = context->scene;
          pGVar7 = (pSVar6->geometries).items[*(uint *)(uVar21 + 0x30 + lVar31)].ptr;
          fVar120 = (pGVar7->time_range).lower;
          fVar120 = pGVar7->fnumTimeSegments *
                    ((*(float *)(ray + k * 4 + 0x70) - fVar120) /
                    ((pGVar7->time_range).upper - fVar120));
          auVar45 = vroundss_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),9);
          auVar45 = vminss_avx(auVar45,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
          auVar68 = vmaxss_avx(ZEXT816(0),auVar45);
          lVar17 = (long)(int)auVar68._0_4_ * 0x38;
          uVar20 = (ulong)*(uint *)(uVar21 + 4 + lVar31);
          lVar11 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar17);
          lVar17 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar17);
          auVar45 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar21 + lVar31) * 4);
          uVar30 = (ulong)*(uint *)(uVar21 + 0x10 + lVar31);
          auVar53 = *(undefined1 (*) [16])(lVar11 + uVar30 * 4);
          uVar23 = (ulong)*(uint *)(uVar21 + 0x20 + lVar31);
          auVar36 = *(undefined1 (*) [16])(lVar11 + uVar23 * 4);
          auVar44 = *(undefined1 (*) [16])(lVar11 + uVar20 * 4);
          uVar24 = (ulong)*(uint *)(uVar21 + 0x14 + lVar31);
          auVar58 = *(undefined1 (*) [16])(lVar11 + uVar24 * 4);
          uVar25 = (ulong)*(uint *)(uVar21 + 0x24 + lVar31);
          auVar37 = *(undefined1 (*) [16])(lVar11 + uVar25 * 4);
          uVar26 = (ulong)*(uint *)(uVar21 + 8 + lVar31);
          auVar59 = *(undefined1 (*) [16])(lVar11 + uVar26 * 4);
          uVar16 = (ulong)*(uint *)(uVar21 + 0x18 + lVar31);
          auVar65 = *(undefined1 (*) [16])(lVar11 + uVar16 * 4);
          uVar28 = (ulong)*(uint *)(uVar21 + 0x28 + lVar31);
          auVar66 = *(undefined1 (*) [16])(lVar11 + uVar28 * 4);
          uVar29 = (ulong)*(uint *)(uVar21 + 0xc + lVar31);
          auVar74 = *(undefined1 (*) [16])(lVar11 + uVar29 * 4);
          uVar32 = (ulong)*(uint *)(uVar21 + 0x1c + lVar31);
          auVar54 = *(undefined1 (*) [16])(lVar11 + uVar32 * 4);
          uVar18 = (ulong)*(uint *)(uVar21 + 0x2c + lVar31);
          auVar60 = *(undefined1 (*) [16])(lVar11 + uVar18 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar21 + lVar31) * 4);
          auVar81 = *(undefined1 (*) [16])(lVar17 + uVar30 * 4);
          fVar120 = fVar120 - auVar68._0_4_;
          auVar68 = vunpcklps_avx(auVar45,auVar59);
          auVar59 = vunpckhps_avx(auVar45,auVar59);
          auVar46 = vunpcklps_avx(auVar44,auVar74);
          auVar44 = vunpckhps_avx(auVar44,auVar74);
          auVar45 = *(undefined1 (*) [16])(lVar17 + uVar20 * 4);
          auVar34 = vunpcklps_avx(auVar59,auVar44);
          auVar35 = vunpcklps_avx(auVar68,auVar46);
          auVar59 = vunpckhps_avx(auVar68,auVar46);
          auVar74 = vunpcklps_avx(auVar53,auVar65);
          auVar44 = vunpckhps_avx(auVar53,auVar65);
          auVar65 = vunpcklps_avx(auVar58,auVar54);
          auVar58 = vunpckhps_avx(auVar58,auVar54);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
          auVar54 = vunpcklps_avx(auVar44,auVar58);
          auVar68 = vunpcklps_avx(auVar74,auVar65);
          auVar58 = vunpckhps_avx(auVar74,auVar65);
          auVar74 = vunpcklps_avx(auVar36,auVar66);
          auVar65 = vunpckhps_avx(auVar36,auVar66);
          auVar46 = vunpcklps_avx(auVar37,auVar60);
          auVar66 = vunpckhps_avx(auVar37,auVar60);
          auVar44 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
          auVar60 = vunpcklps_avx(auVar65,auVar66);
          auVar36 = vunpcklps_avx(auVar74,auVar46);
          auVar65 = vunpckhps_avx(auVar74,auVar46);
          auVar66 = vunpcklps_avx(auVar75,auVar53);
          auVar53 = vunpckhps_avx(auVar75,auVar53);
          auVar74 = vunpcklps_avx(auVar45,auVar44);
          auVar44 = vunpckhps_avx(auVar45,auVar44);
          auVar45 = *(undefined1 (*) [16])(lVar17 + uVar16 * 4);
          auVar75 = vunpcklps_avx(auVar53,auVar44);
          auVar46 = vunpcklps_avx(auVar66,auVar74);
          auVar44 = vunpckhps_avx(auVar66,auVar74);
          auVar74 = vunpcklps_avx(auVar81,auVar45);
          auVar66 = vunpckhps_avx(auVar81,auVar45);
          auVar45 = *(undefined1 (*) [16])(lVar17 + uVar24 * 4);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar32 * 4);
          auVar81 = vunpcklps_avx(auVar45,auVar53);
          auVar45 = vunpckhps_avx(auVar45,auVar53);
          auVar37 = vunpcklps_avx(auVar66,auVar45);
          auVar47 = vunpcklps_avx(auVar74,auVar81);
          auVar66 = vunpckhps_avx(auVar74,auVar81);
          auVar45 = *(undefined1 (*) [16])(lVar17 + uVar23 * 4);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar28 * 4);
          auVar81 = vunpcklps_avx(auVar45,auVar53);
          auVar74 = vunpckhps_avx(auVar45,auVar53);
          auVar45 = *(undefined1 (*) [16])(lVar17 + uVar25 * 4);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar18 * 4);
          auVar48 = vunpcklps_avx(auVar45,auVar53);
          auVar45 = vunpckhps_avx(auVar45,auVar53);
          auVar53 = vunpcklps_avx(auVar74,auVar45);
          auVar74 = vunpcklps_avx(auVar81,auVar48);
          auVar45 = vunpckhps_avx(auVar81,auVar48);
          fVar126 = 1.0 - fVar120;
          auVar115._4_4_ = fVar126;
          auVar115._0_4_ = fVar126;
          auVar115._8_4_ = fVar126;
          auVar115._12_4_ = fVar126;
          auVar81._0_4_ = fVar120 * auVar46._0_4_;
          auVar81._4_4_ = fVar120 * auVar46._4_4_;
          auVar81._8_4_ = fVar120 * auVar46._8_4_;
          auVar81._12_4_ = fVar120 * auVar46._12_4_;
          auVar81 = vfmadd231ps_fma(auVar81,auVar115,auVar35);
          auVar97._0_4_ = fVar120 * auVar44._0_4_;
          auVar97._4_4_ = fVar120 * auVar44._4_4_;
          auVar97._8_4_ = fVar120 * auVar44._8_4_;
          auVar97._12_4_ = fVar120 * auVar44._12_4_;
          auVar59 = vfmadd231ps_fma(auVar97,auVar115,auVar59);
          auVar89._0_4_ = fVar120 * auVar75._0_4_;
          auVar89._4_4_ = fVar120 * auVar75._4_4_;
          auVar89._8_4_ = fVar120 * auVar75._8_4_;
          auVar89._12_4_ = fVar120 * auVar75._12_4_;
          auVar75 = vfmadd231ps_fma(auVar89,auVar115,auVar34);
          auVar76._0_4_ = fVar120 * auVar47._0_4_;
          auVar76._4_4_ = fVar120 * auVar47._4_4_;
          auVar76._8_4_ = fVar120 * auVar47._8_4_;
          auVar76._12_4_ = fVar120 * auVar47._12_4_;
          auVar68 = vfmadd231ps_fma(auVar76,auVar115,auVar68);
          auVar67._0_4_ = fVar120 * auVar66._0_4_;
          auVar67._4_4_ = fVar120 * auVar66._4_4_;
          auVar67._8_4_ = fVar120 * auVar66._8_4_;
          auVar67._12_4_ = fVar120 * auVar66._12_4_;
          auVar66 = vfmadd231ps_fma(auVar67,auVar115,auVar58);
          puVar1 = (undefined8 *)(uVar21 + 0x30 + lVar31);
          local_1018 = *puVar1;
          uStack_1010 = puVar1[1];
          puVar1 = (undefined8 *)(uVar21 + 0x40 + lVar31);
          auVar46._0_4_ = fVar120 * auVar37._0_4_;
          auVar46._4_4_ = fVar120 * auVar37._4_4_;
          auVar46._8_4_ = fVar120 * auVar37._8_4_;
          auVar46._12_4_ = fVar120 * auVar37._12_4_;
          auVar54 = vfmadd231ps_fma(auVar46,auVar115,auVar54);
          auVar55._0_4_ = fVar120 * auVar74._0_4_;
          auVar55._4_4_ = fVar120 * auVar74._4_4_;
          auVar55._8_4_ = fVar120 * auVar74._8_4_;
          auVar55._12_4_ = fVar120 * auVar74._12_4_;
          auVar61._0_4_ = fVar120 * auVar45._0_4_;
          auVar61._4_4_ = fVar120 * auVar45._4_4_;
          auVar61._8_4_ = fVar120 * auVar45._8_4_;
          auVar61._12_4_ = fVar120 * auVar45._12_4_;
          auVar105._0_4_ = fVar120 * auVar53._0_4_;
          auVar105._4_4_ = fVar120 * auVar53._4_4_;
          auVar105._8_4_ = fVar120 * auVar53._8_4_;
          auVar105._12_4_ = fVar120 * auVar53._12_4_;
          auVar74 = vfmadd231ps_fma(auVar55,auVar115,auVar36);
          auVar46 = vfmadd231ps_fma(auVar61,auVar115,auVar65);
          auVar60 = vfmadd231ps_fma(auVar105,auVar115,auVar60);
          local_1198 = *puVar1;
          uStack_1190 = puVar1[1];
          uVar13 = *(undefined4 *)(ray + k * 4);
          auVar34._4_4_ = uVar13;
          auVar34._0_4_ = uVar13;
          auVar34._8_4_ = uVar13;
          auVar34._12_4_ = uVar13;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar117._4_4_ = uVar13;
          auVar117._0_4_ = uVar13;
          auVar117._8_4_ = uVar13;
          auVar117._12_4_ = uVar13;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar122._4_4_ = uVar13;
          auVar122._0_4_ = uVar13;
          auVar122._8_4_ = uVar13;
          auVar122._12_4_ = uVar13;
          auVar44 = vsubps_avx(auVar81,auVar34);
          auVar58 = vsubps_avx(auVar59,auVar117);
          auVar45 = vsubps_avx(auVar75,auVar122);
          auVar53 = vsubps_avx(auVar68,auVar34);
          auVar59 = vsubps_avx(auVar66,auVar117);
          auVar65 = vsubps_avx(auVar54,auVar122);
          auVar66 = vsubps_avx(auVar74,auVar34);
          auVar74 = vsubps_avx(auVar46,auVar117);
          auVar54 = vsubps_avx(auVar60,auVar122);
          auVar60 = vsubps_avx(auVar66,auVar44);
          auVar75 = vsubps_avx(auVar74,auVar58);
          auVar81 = vsubps_avx(auVar54,auVar45);
          auVar35._0_4_ = auVar66._0_4_ + auVar44._0_4_;
          auVar35._4_4_ = auVar66._4_4_ + auVar44._4_4_;
          auVar35._8_4_ = auVar66._8_4_ + auVar44._8_4_;
          auVar35._12_4_ = auVar66._12_4_ + auVar44._12_4_;
          auVar62._0_4_ = auVar74._0_4_ + auVar58._0_4_;
          auVar62._4_4_ = auVar74._4_4_ + auVar58._4_4_;
          auVar62._8_4_ = auVar74._8_4_ + auVar58._8_4_;
          auVar62._12_4_ = auVar74._12_4_ + auVar58._12_4_;
          fVar126 = auVar45._0_4_;
          auVar68._0_4_ = auVar54._0_4_ + fVar126;
          fVar135 = auVar45._4_4_;
          auVar68._4_4_ = auVar54._4_4_ + fVar135;
          fVar108 = auVar45._8_4_;
          auVar68._8_4_ = auVar54._8_4_ + fVar108;
          fVar113 = auVar45._12_4_;
          auVar68._12_4_ = auVar54._12_4_ + fVar113;
          auVar118._0_4_ = auVar81._0_4_ * auVar62._0_4_;
          auVar118._4_4_ = auVar81._4_4_ * auVar62._4_4_;
          auVar118._8_4_ = auVar81._8_4_ * auVar62._8_4_;
          auVar118._12_4_ = auVar81._12_4_ * auVar62._12_4_;
          auVar46 = vfmsub231ps_fma(auVar118,auVar75,auVar68);
          auVar69._0_4_ = auVar60._0_4_ * auVar68._0_4_;
          auVar69._4_4_ = auVar60._4_4_ * auVar68._4_4_;
          auVar69._8_4_ = auVar60._8_4_ * auVar68._8_4_;
          auVar69._12_4_ = auVar60._12_4_ * auVar68._12_4_;
          auVar68 = vfmsub231ps_fma(auVar69,auVar81,auVar35);
          auVar36._0_4_ = auVar75._0_4_ * auVar35._0_4_;
          auVar36._4_4_ = auVar75._4_4_ * auVar35._4_4_;
          auVar36._8_4_ = auVar75._8_4_ * auVar35._8_4_;
          auVar36._12_4_ = auVar75._12_4_ * auVar35._12_4_;
          auVar34 = vfmsub231ps_fma(auVar36,auVar60,auVar62);
          fVar120 = *(float *)(ray + k * 4 + 0x60);
          auVar56._0_4_ = fVar120 * auVar34._0_4_;
          auVar56._4_4_ = fVar120 * auVar34._4_4_;
          auVar56._8_4_ = fVar120 * auVar34._8_4_;
          auVar56._12_4_ = fVar120 * auVar34._12_4_;
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar98._4_4_ = uVar13;
          auVar98._0_4_ = uVar13;
          auVar98._8_4_ = uVar13;
          auVar98._12_4_ = uVar13;
          auVar68 = vfmadd231ps_fma(auVar56,auVar98,auVar68);
          uVar13 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar123._4_4_ = uVar13;
          auVar123._0_4_ = uVar13;
          auVar123._8_4_ = uVar13;
          auVar123._12_4_ = uVar13;
          local_1038 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar68,auVar123,auVar46);
          auVar68 = vsubps_avx(auVar58,auVar59);
          local_1028 = vsubps_avx(auVar45,auVar65);
          auVar63._0_4_ = auVar58._0_4_ + auVar59._0_4_;
          auVar63._4_4_ = auVar58._4_4_ + auVar59._4_4_;
          auVar63._8_4_ = auVar58._8_4_ + auVar59._8_4_;
          auVar63._12_4_ = auVar58._12_4_ + auVar59._12_4_;
          auVar70._0_4_ = auVar65._0_4_ + fVar126;
          auVar70._4_4_ = auVar65._4_4_ + fVar135;
          auVar70._8_4_ = auVar65._8_4_ + fVar108;
          auVar70._12_4_ = auVar65._12_4_ + fVar113;
          fVar116 = local_1028._0_4_;
          auVar82._0_4_ = auVar63._0_4_ * fVar116;
          fVar106 = local_1028._4_4_;
          auVar82._4_4_ = auVar63._4_4_ * fVar106;
          fVar109 = local_1028._8_4_;
          auVar82._8_4_ = auVar63._8_4_ * fVar109;
          fVar112 = local_1028._12_4_;
          auVar82._12_4_ = auVar63._12_4_ * fVar112;
          auVar34 = vfmsub231ps_fma(auVar82,auVar68,auVar70);
          auVar46 = vsubps_avx(auVar44,auVar53);
          fVar127 = auVar46._0_4_;
          auVar90._0_4_ = fVar127 * auVar70._0_4_;
          fVar130 = auVar46._4_4_;
          auVar90._4_4_ = fVar130 * auVar70._4_4_;
          fVar132 = auVar46._8_4_;
          auVar90._8_4_ = fVar132 * auVar70._8_4_;
          fVar134 = auVar46._12_4_;
          auVar90._12_4_ = fVar134 * auVar70._12_4_;
          auVar71._0_4_ = auVar44._0_4_ + auVar53._0_4_;
          auVar71._4_4_ = auVar44._4_4_ + auVar53._4_4_;
          auVar71._8_4_ = auVar44._8_4_ + auVar53._8_4_;
          auVar71._12_4_ = auVar44._12_4_ + auVar53._12_4_;
          auVar45 = vfmsub231ps_fma(auVar90,local_1028,auVar71);
          fVar104 = auVar68._0_4_;
          auVar72._0_4_ = auVar71._0_4_ * fVar104;
          fVar107 = auVar68._4_4_;
          auVar72._4_4_ = auVar71._4_4_ * fVar107;
          fVar111 = auVar68._8_4_;
          auVar72._8_4_ = auVar71._8_4_ * fVar111;
          fVar114 = auVar68._12_4_;
          auVar72._12_4_ = auVar71._12_4_ * fVar114;
          auVar35 = vfmsub231ps_fma(auVar72,auVar46,auVar63);
          auVar73._0_4_ = fVar120 * auVar35._0_4_;
          auVar73._4_4_ = fVar120 * auVar35._4_4_;
          auVar73._8_4_ = fVar120 * auVar35._8_4_;
          auVar73._12_4_ = fVar120 * auVar35._12_4_;
          auVar45 = vfmadd231ps_fma(auVar73,auVar98,auVar45);
          auVar35 = vfmadd231ps_fma(auVar45,auVar123,auVar34);
          auVar34 = vsubps_avx(auVar53,auVar66);
          auVar83._0_4_ = auVar66._0_4_ + auVar53._0_4_;
          auVar83._4_4_ = auVar66._4_4_ + auVar53._4_4_;
          auVar83._8_4_ = auVar66._8_4_ + auVar53._8_4_;
          auVar83._12_4_ = auVar66._12_4_ + auVar53._12_4_;
          auVar66 = vsubps_avx(auVar59,auVar74);
          auVar37._0_4_ = auVar59._0_4_ + auVar74._0_4_;
          auVar37._4_4_ = auVar59._4_4_ + auVar74._4_4_;
          auVar37._8_4_ = auVar59._8_4_ + auVar74._8_4_;
          auVar37._12_4_ = auVar59._12_4_ + auVar74._12_4_;
          auVar59 = vsubps_avx(auVar65,auVar54);
          auVar47._0_4_ = auVar65._0_4_ + auVar54._0_4_;
          auVar47._4_4_ = auVar65._4_4_ + auVar54._4_4_;
          auVar47._8_4_ = auVar65._8_4_ + auVar54._8_4_;
          auVar47._12_4_ = auVar65._12_4_ + auVar54._12_4_;
          auVar91._0_4_ = auVar37._0_4_ * auVar59._0_4_;
          auVar91._4_4_ = auVar37._4_4_ * auVar59._4_4_;
          auVar91._8_4_ = auVar37._8_4_ * auVar59._8_4_;
          auVar91._12_4_ = auVar37._12_4_ * auVar59._12_4_;
          auVar53 = vfmsub231ps_fma(auVar91,auVar66,auVar47);
          auVar48._0_4_ = auVar47._0_4_ * auVar34._0_4_;
          auVar48._4_4_ = auVar47._4_4_ * auVar34._4_4_;
          auVar48._8_4_ = auVar47._8_4_ * auVar34._8_4_;
          auVar48._12_4_ = auVar47._12_4_ * auVar34._12_4_;
          auVar45 = vfmsub231ps_fma(auVar48,auVar59,auVar83);
          auVar84._0_4_ = auVar66._0_4_ * auVar83._0_4_;
          auVar84._4_4_ = auVar66._4_4_ * auVar83._4_4_;
          auVar84._8_4_ = auVar66._8_4_ * auVar83._8_4_;
          auVar84._12_4_ = auVar66._12_4_ * auVar83._12_4_;
          auVar65 = vfmsub231ps_fma(auVar84,auVar34,auVar37);
          auVar85._0_4_ = fVar120 * auVar65._0_4_;
          auVar85._4_4_ = fVar120 * auVar65._4_4_;
          auVar85._8_4_ = fVar120 * auVar65._8_4_;
          auVar85._12_4_ = fVar120 * auVar65._12_4_;
          auVar45 = vfmadd231ps_fma(auVar85,auVar98,auVar45);
          auVar65 = vfmadd231ps_fma(auVar45,auVar123,auVar53);
          auVar110._0_4_ = auVar65._0_4_ + local_1038.v[0] + auVar35._0_4_;
          auVar110._4_4_ = auVar65._4_4_ + local_1038.v[1] + auVar35._4_4_;
          auVar110._8_4_ = auVar65._8_4_ + local_1038.v[2] + auVar35._8_4_;
          auVar110._12_4_ = auVar65._12_4_ + local_1038.v[3] + auVar35._12_4_;
          auVar129._8_4_ = 0x7fffffff;
          auVar129._0_8_ = 0x7fffffff7fffffff;
          auVar129._12_4_ = 0x7fffffff;
          auVar45 = vminps_avx((undefined1  [16])local_1038,auVar35);
          auVar45 = vminps_avx(auVar45,auVar65);
          local_1048 = vandps_avx(auVar110,auVar129);
          auVar99._0_4_ = local_1048._0_4_ * 1.1920929e-07;
          auVar99._4_4_ = local_1048._4_4_ * 1.1920929e-07;
          auVar99._8_4_ = local_1048._8_4_ * 1.1920929e-07;
          auVar99._12_4_ = local_1048._12_4_ * 1.1920929e-07;
          uVar16 = CONCAT44(auVar99._4_4_,auVar99._0_4_);
          auVar92._0_8_ = uVar16 ^ 0x8000000080000000;
          auVar92._8_4_ = -auVar99._8_4_;
          auVar92._12_4_ = -auVar99._12_4_;
          auVar45 = vcmpps_avx(auVar45,auVar92,5);
          auVar53 = vmaxps_avx((undefined1  [16])local_1038,auVar35);
          auVar53 = vmaxps_avx(auVar53,auVar65);
          auVar53 = vcmpps_avx(auVar53,auVar99,2);
          auVar45 = vorps_avx(auVar45,auVar53);
          if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar45[0xf] < '\0') {
            auVar49._0_4_ = fVar104 * auVar81._0_4_;
            auVar49._4_4_ = fVar107 * auVar81._4_4_;
            auVar49._8_4_ = fVar111 * auVar81._8_4_;
            auVar49._12_4_ = fVar114 * auVar81._12_4_;
            auVar86._0_4_ = fVar127 * auVar75._0_4_;
            auVar86._4_4_ = fVar130 * auVar75._4_4_;
            auVar86._8_4_ = fVar132 * auVar75._8_4_;
            auVar86._12_4_ = fVar134 * auVar75._12_4_;
            auVar65 = vfmsub213ps_fma(auVar75,local_1028,auVar49);
            auVar93._0_4_ = auVar66._0_4_ * fVar116;
            auVar93._4_4_ = auVar66._4_4_ * fVar106;
            auVar93._8_4_ = auVar66._8_4_ * fVar109;
            auVar93._12_4_ = auVar66._12_4_ * fVar112;
            auVar100._0_4_ = fVar127 * auVar59._0_4_;
            auVar100._4_4_ = fVar130 * auVar59._4_4_;
            auVar100._8_4_ = fVar132 * auVar59._8_4_;
            auVar100._12_4_ = fVar134 * auVar59._12_4_;
            auVar74 = vfmsub213ps_fma(auVar59,auVar68,auVar93);
            auVar53 = vandps_avx(auVar129,auVar49);
            auVar59 = vandps_avx(auVar129,auVar93);
            auVar53 = vcmpps_avx(auVar53,auVar59,1);
            local_1108 = vblendvps_avx(auVar74,auVar65,auVar53);
            auVar77._0_4_ = fVar104 * auVar34._0_4_;
            auVar77._4_4_ = fVar107 * auVar34._4_4_;
            auVar77._8_4_ = fVar111 * auVar34._8_4_;
            auVar77._12_4_ = fVar114 * auVar34._12_4_;
            auVar65 = vfmsub213ps_fma(auVar34,local_1028,auVar100);
            auVar94._0_4_ = auVar60._0_4_ * fVar116;
            auVar94._4_4_ = auVar60._4_4_ * fVar106;
            auVar94._8_4_ = auVar60._8_4_ * fVar109;
            auVar94._12_4_ = auVar60._12_4_ * fVar112;
            auVar74 = vfmsub213ps_fma(auVar81,auVar46,auVar94);
            auVar53 = vandps_avx(auVar129,auVar94);
            auVar59 = vandps_avx(auVar100,auVar129);
            auVar53 = vcmpps_avx(auVar53,auVar59,1);
            local_10f8 = vblendvps_avx(auVar65,auVar74,auVar53);
            auVar65 = vfmsub213ps_fma(auVar60,auVar68,auVar86);
            auVar66 = vfmsub213ps_fma(auVar66,auVar46,auVar77);
            auVar53 = vandps_avx(auVar129,auVar86);
            auVar59 = vandps_avx(auVar129,auVar77);
            auVar53 = vcmpps_avx(auVar53,auVar59,1);
            local_10e8 = vblendvps_avx(auVar66,auVar65,auVar53);
            auVar78._0_4_ = local_10e8._0_4_ * fVar120;
            auVar78._4_4_ = local_10e8._4_4_ * fVar120;
            auVar78._8_4_ = local_10e8._8_4_ * fVar120;
            auVar78._12_4_ = local_10e8._12_4_ * fVar120;
            auVar53 = vfmadd213ps_fma(auVar98,local_10f8,auVar78);
            auVar53 = vfmadd213ps_fma(auVar123,local_1108,auVar53);
            auVar79._0_4_ = auVar53._0_4_ + auVar53._0_4_;
            auVar79._4_4_ = auVar53._4_4_ + auVar53._4_4_;
            auVar79._8_4_ = auVar53._8_4_ + auVar53._8_4_;
            auVar79._12_4_ = auVar53._12_4_ + auVar53._12_4_;
            auVar87._0_4_ = local_10e8._0_4_ * fVar126;
            auVar87._4_4_ = local_10e8._4_4_ * fVar135;
            auVar87._8_4_ = local_10e8._8_4_ * fVar108;
            auVar87._12_4_ = local_10e8._12_4_ * fVar113;
            auVar53 = vfmadd213ps_fma(auVar58,local_10f8,auVar87);
            auVar44 = vfmadd213ps_fma(auVar44,local_1108,auVar53);
            auVar53 = vrcpps_avx(auVar79);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar58 = vfnmadd213ps_fma(auVar53,auVar79,auVar101);
            auVar53 = vfmadd132ps_fma(auVar58,auVar53,auVar53);
            local_1118._0_4_ = auVar53._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
            local_1118._4_4_ = auVar53._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
            local_1118._8_4_ = auVar53._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
            local_1118._12_4_ = auVar53._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
            auVar43 = ZEXT1664(local_1118);
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar88._4_4_ = uVar13;
            auVar88._0_4_ = uVar13;
            auVar88._8_4_ = uVar13;
            auVar88._12_4_ = uVar13;
            auVar53 = vcmpps_avx(auVar88,local_1118,2);
            uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar102._4_4_ = uVar13;
            auVar102._0_4_ = uVar13;
            auVar102._8_4_ = uVar13;
            auVar102._12_4_ = uVar13;
            auVar95 = ZEXT1664(auVar102);
            auVar44 = vcmpps_avx(local_1118,auVar102,2);
            auVar53 = vandps_avx(auVar53,auVar44);
            auVar44 = auVar45 & auVar53;
            if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar44[0xf] < '\0') {
              auVar45 = vandps_avx(auVar53,auVar45);
              auVar53 = vcmpps_avx(auVar79,_DAT_01f7aa10,4);
              auVar44 = auVar53 & auVar45;
              if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar44[0xf] < '\0') {
                valid.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar45,auVar53);
                tNear.field_0 = local_1038;
                pUVar15 = &mapUV;
                auVar45 = vrcpps_avx(auVar110);
                auVar57._8_4_ = 0x3f800000;
                auVar57._0_8_ = 0x3f8000003f800000;
                auVar57._12_4_ = 0x3f800000;
                auVar53 = vfnmadd213ps_fma(auVar110,auVar45,auVar57);
                auVar53 = vfmadd132ps_fma(auVar53,auVar45,auVar45);
                auVar50._8_4_ = 0x219392ef;
                auVar50._0_8_ = 0x219392ef219392ef;
                auVar50._12_4_ = 0x219392ef;
                auVar45 = vcmpps_avx(local_1048,auVar50,5);
                auVar45 = vandps_avx(auVar53,auVar45);
                auVar38._0_4_ = local_1038.v[0] * auVar45._0_4_;
                auVar38._4_4_ = local_1038.v[1] * auVar45._4_4_;
                auVar38._8_4_ = local_1038.v[2] * auVar45._8_4_;
                auVar38._12_4_ = local_1038.v[3] * auVar45._12_4_;
                local_1138 = vminps_avx(auVar38,auVar57);
                auVar39._0_4_ = auVar45._0_4_ * auVar35._0_4_;
                auVar39._4_4_ = auVar45._4_4_ * auVar35._4_4_;
                auVar39._8_4_ = auVar45._8_4_ * auVar35._8_4_;
                auVar39._12_4_ = auVar45._12_4_ * auVar35._12_4_;
                local_1128 = vminps_avx(auVar39,auVar57);
                auVar51._8_4_ = 0x7f800000;
                auVar51._0_8_ = 0x7f8000007f800000;
                auVar51._12_4_ = 0x7f800000;
                auVar45 = vblendvps_avx(auVar51,local_1118,(undefined1  [16])valid.field_0);
                auVar53 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar53 = vminps_avx(auVar53,auVar45);
                auVar44 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar44,auVar53);
                auVar45 = vcmpps_avx(auVar45,auVar53,0);
                auVar44 = (undefined1  [16])valid.field_0 & auVar45;
                auVar53 = vpcmpeqd_avx(auVar53,auVar53);
                if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar44[0xf] < '\0') {
                  auVar53 = auVar45;
                }
                auVar45 = vandps_avx((undefined1  [16])valid.field_0,auVar53);
                do {
                  auVar45 = vpslld_avx(auVar45,0x1f);
                  uVar13 = vmovmskps_avx(auVar45);
                  lVar11 = 0;
                  for (uVar16 = CONCAT44((int)((ulong)pUVar15 >> 0x20),uVar13); (uVar16 & 1) == 0;
                      uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                    lVar11 = lVar11 + 1;
                  }
                  uVar19 = *(uint *)((long)&local_1018 + lVar11 * 4);
                  pUVar15 = (UVIdentity<4> *)(ulong)uVar19;
                  pGVar7 = (pSVar6->geometries).items[(long)pUVar15].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    valid.field_0.v[lVar11] = 0.0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar16 = (ulong)(uint)((int)lVar11 << 2);
                      uVar13 = *(undefined4 *)(local_1138 + uVar16);
                      uVar3 = *(undefined4 *)(local_1128 + uVar16);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar16);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1108 + uVar16);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10f8 + uVar16);
                      *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_10e8 + uVar16);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar13;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_1198 + uVar16);
                      *(uint *)(ray + k * 4 + 0x120) = uVar19;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar16 = (ulong)(uint)((int)lVar11 * 4);
                    uVar13 = *(undefined4 *)(local_1138 + uVar16);
                    local_fd8._4_4_ = uVar13;
                    local_fd8._0_4_ = uVar13;
                    local_fd8._8_4_ = uVar13;
                    local_fd8._12_4_ = uVar13;
                    local_fc8 = *(undefined4 *)(local_1128 + uVar16);
                    local_fa8._4_4_ = uVar19;
                    local_fa8._0_4_ = uVar19;
                    local_fa8._8_4_ = uVar19;
                    local_fa8._12_4_ = uVar19;
                    uVar13 = *(undefined4 *)((long)&local_1198 + uVar16);
                    auVar64._4_4_ = uVar13;
                    auVar64._0_4_ = uVar13;
                    auVar64._8_4_ = uVar13;
                    auVar64._12_4_ = uVar13;
                    uVar13 = *(undefined4 *)(local_1108 + uVar16);
                    uVar3 = *(undefined4 *)(local_10f8 + uVar16);
                    local_ff8._4_4_ = uVar3;
                    local_ff8._0_4_ = uVar3;
                    local_ff8._8_4_ = uVar3;
                    local_ff8._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)(local_10e8 + uVar16);
                    local_fe8._4_4_ = uVar3;
                    local_fe8._0_4_ = uVar3;
                    local_fe8._8_4_ = uVar3;
                    local_fe8._12_4_ = uVar3;
                    local_1008[0] = (RTCHitN)(char)uVar13;
                    local_1008[1] = (RTCHitN)(char)((uint)uVar13 >> 8);
                    local_1008[2] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                    local_1008[3] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                    local_1008[4] = (RTCHitN)(char)uVar13;
                    local_1008[5] = (RTCHitN)(char)((uint)uVar13 >> 8);
                    local_1008[6] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                    local_1008[7] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                    local_1008[8] = (RTCHitN)(char)uVar13;
                    local_1008[9] = (RTCHitN)(char)((uint)uVar13 >> 8);
                    local_1008[10] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                    local_1008[0xb] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                    local_1008[0xc] = (RTCHitN)(char)uVar13;
                    local_1008[0xd] = (RTCHitN)(char)((uint)uVar13 >> 8);
                    local_1008[0xe] = (RTCHitN)(char)((uint)uVar13 >> 0x10);
                    local_1008[0xf] = (RTCHitN)(char)((uint)uVar13 >> 0x18);
                    uStack_fc4 = local_fc8;
                    uStack_fc0 = local_fc8;
                    uStack_fbc = local_fc8;
                    local_fb8 = auVar64;
                    vpcmpeqd_avx2(ZEXT1632(local_fd8),ZEXT1632(local_fd8));
                    uStack_f94 = context->user->instID[0];
                    local_f98 = uStack_f94;
                    uStack_f90 = uStack_f94;
                    uStack_f8c = uStack_f94;
                    uStack_f88 = context->user->instPrimID[0];
                    uStack_f84 = uStack_f88;
                    uStack_f80 = uStack_f88;
                    uStack_f7c = uStack_f88;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar16);
                    local_1208 = *local_11f8;
                    args.valid = (int *)local_1208;
                    args.geometryUserPtr = pGVar7->userPtr;
                    args.context = context->user;
                    args.hit = local_1008;
                    args.N = 4;
                    pUVar15 = (UVIdentity<4> *)pGVar7->intersectionFilterN;
                    auVar45 = auVar43._0_16_;
                    auVar53 = auVar95._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pUVar15 != (UVIdentity<4> *)0x0) {
                      pUVar15 = (UVIdentity<4> *)(*(code *)pUVar15)(&args);
                      auVar95 = ZEXT1664(auVar53);
                      auVar43 = ZEXT1664(auVar45);
                    }
                    if (local_1208 == (undefined1  [16])0x0) {
                      auVar45 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar45 = auVar45 ^ _DAT_01f7ae20;
                    }
                    else {
                      pUVar15 = (UVIdentity<4> *)context->args->filter;
                      if ((pUVar15 != (UVIdentity<4> *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        pUVar15 = (UVIdentity<4> *)(*(code *)pUVar15)(&args);
                        auVar95 = ZEXT1664(auVar53);
                        auVar43 = ZEXT1664(auVar45);
                      }
                      auVar53 = vpcmpeqd_avx(local_1208,_DAT_01f7aa10);
                      auVar44 = vpcmpeqd_avx(auVar64,auVar64);
                      auVar45 = auVar53 ^ auVar44;
                      if (local_1208 != (undefined1  [16])0x0) {
                        auVar53 = auVar53 ^ auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])args.hit);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x10));
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x20));
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x30));
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x40));
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x50));
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x60));
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar44;
                        auVar44 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x70));
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar44;
                        auVar53 = vmaskmovps_avx(auVar53,*(undefined1 (*) [16])(args.hit + 0x80));
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar53;
                        pUVar15 = (UVIdentity<4> *)args.ray;
                      }
                    }
                    auVar41._8_8_ = 0x100000001;
                    auVar41._0_8_ = 0x100000001;
                    if ((auVar41 & auVar45) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar95._0_4_;
                    }
                    else {
                      auVar95 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    valid.field_0.v[lVar11] = 0.0;
                    uVar13 = auVar95._0_4_;
                    auVar42._4_4_ = uVar13;
                    auVar42._0_4_ = uVar13;
                    auVar42._8_4_ = uVar13;
                    auVar42._12_4_ = uVar13;
                    auVar45 = vcmpps_avx(auVar43._0_16_,auVar42,2);
                    valid.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vandps_avx(auVar45,(undefined1  [16])valid.field_0);
                  }
                  if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                        (undefined1  [16])0x0 &&
                       ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
                       (undefined1  [16])0x0) &&
                      ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) break;
                  auVar52._8_4_ = 0x7f800000;
                  auVar52._0_8_ = 0x7f8000007f800000;
                  auVar52._12_4_ = 0x7f800000;
                  auVar45 = vblendvps_avx(auVar52,auVar43._0_16_,(undefined1  [16])valid.field_0);
                  auVar53 = vshufps_avx(auVar45,auVar45,0xb1);
                  auVar53 = vminps_avx(auVar53,auVar45);
                  auVar44 = vshufpd_avx(auVar53,auVar53,1);
                  auVar53 = vminps_avx(auVar44,auVar53);
                  auVar45 = vcmpps_avx(auVar45,auVar53,0);
                  auVar53 = (undefined1  [16])valid.field_0 & auVar45;
                  aVar40 = valid.field_0;
                  if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar53[0xf] < '\0') {
                    aVar40.v = (__m128)vandps_avx(auVar45,valid.field_0);
                  }
                  auVar45 = vpcmpgtd_avx(ZEXT816(0) << 0x20,(undefined1  [16])aVar40);
                } while( true );
              }
            }
          }
          local_11e8 = local_11e8 + 1;
        } while (local_11e8 != local_11f0);
      }
      uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar43 = ZEXT1664(CONCAT412(uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13))));
      auVar95 = ZEXT1664(local_1058);
      auVar96 = ZEXT1664(local_1068);
      auVar103 = ZEXT1664(local_1078);
      fVar104 = local_1088;
      fVar106 = fStack_1084;
      fVar107 = fStack_1080;
      fVar108 = fStack_107c;
      fVar109 = local_1098;
      fVar111 = fStack_1094;
      fVar112 = fStack_1090;
      fVar113 = fStack_108c;
      fVar114 = local_10a8;
      fVar127 = fStack_10a4;
      fVar130 = fStack_10a0;
      fVar116 = fStack_109c;
      fVar132 = local_10b8;
      fVar134 = fStack_10b4;
      fVar119 = fStack_10b0;
      fVar120 = fStack_10ac;
      fVar121 = local_10c8;
      fVar124 = fStack_10c4;
      fVar125 = fStack_10c0;
      fVar126 = fStack_10bc;
      fVar128 = local_10d8;
      fVar131 = fStack_10d4;
      fVar133 = fStack_10d0;
      fVar135 = fStack_10cc;
    }
    if (pSVar14 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }